

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta.h
# Opt level: O2

ProString * __thiscall
QMakeMetaInfo::first(ProString *__return_storage_ptr__,QMakeMetaInfo *this,ProKey *v)

{
  bool bVar1;
  QList<ProString> *this_00;
  iterator other;
  
  bVar1 = isEmpty(this,v);
  if (bVar1) {
    ProString::ProString(__return_storage_ptr__,"");
  }
  else {
    this_00 = &QMap<ProKey,_ProStringList>::operator[](&this->vars,v)->super_QList<ProString>;
    other = QList<ProString>::begin(this_00);
    ProString::ProString(__return_storage_ptr__,other.i);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ProString QMakeMetaInfo::first(const ProKey &v)
{
#if defined(Q_CC_SUN) && (__SUNPRO_CC == 0x500) || defined(Q_CC_HP)
    // workaround for Sun WorkShop 5.0 bug fixed in Forte 6
    if (isEmpty(v))
        return ProString("");
    else
        return vars[v].first();
#else
    return isEmpty(v) ? ProString("") : vars[v].first();
#endif
}